

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

int __thiscall Heap<SAT::VarOrderLt>::removeMin(Heap<SAT::VarOrderLt> *this)

{
  uint index;
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int *piVar4;
  long in_RDI;
  int x;
  int in_stack_0000002c;
  Heap<SAT::VarOrderLt> *in_stack_00000030;
  
  puVar3 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),0);
  index = *puVar3;
  piVar4 = vec<int>::last((vec<int> *)(in_RDI + 8));
  iVar1 = *piVar4;
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),0);
  *piVar4 = iVar1;
  puVar3 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),0);
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),*puVar3);
  *piVar4 = 0;
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),index);
  *piVar4 = -1;
  vec<int>::pop((vec<int> *)(in_RDI + 8));
  uVar2 = vec<int>::size((vec<int> *)(in_RDI + 8));
  if (1 < uVar2) {
    percolateDown(in_stack_00000030,in_stack_0000002c);
  }
  return index;
}

Assistant:

int removeMin() {
		const int x = heap[0];
		heap[0] = heap.last();
		indices[heap[0]] = 0;
		indices[x] = -1;
		heap.pop();
		if (heap.size() > 1) {
			percolateDown(0);
		}
		return x;
	}